

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Pred5_Test::Body
          (iu_SyntaxTest_x_iutest_x_Pred5_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_201;
  AssertionResult iutest_ar;
  int local_1d8;
  undefined4 uStack_1d4;
  char *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  ios_base local_128 [264];
  
  iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",in_stack_fffffffffffffe30,
             (_func_bool_int_int_int_int_int *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe60);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)&stack0xfffffffffffffe58,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&stack0xfffffffffffffe58);
    local_1d8 = 1;
    iutest::detail::iuStreamMessage::operator<<
              ((iuStreamMessage *)&stack0xfffffffffffffe58,&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
    iutest::AssertionHelper::OnFixed
              ((AssertionHelper *)&local_1d8,(Fixed *)&stack0xfffffffffffffe58,false);
    if ((undefined1 *)CONCAT44(uStack_1d4,local_1d8) != &stack0xfffffffffffffe38) {
      operator_delete((undefined1 *)CONCAT44(uStack_1d4,local_1d8),
                      (ulong)(in_stack_fffffffffffffe38 + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == &iutest_ar.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &iutest_ar.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",in_stack_fffffffffffffe30,
               (_func_bool_int_int_int_int_int *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe40
               ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe58,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe58);
      local_1d8 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)&stack0xfffffffffffffe58,&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      in_stack_fffffffffffffe48 = 0x33adb0;
      in_stack_fffffffffffffe50 = 0x267;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&local_1d8,(Fixed *)&stack0xfffffffffffffe58,false);
      if ((undefined1 *)CONCAT44(uStack_1d4,local_1d8) != &stack0xfffffffffffffe38) {
        operator_delete((undefined1 *)CONCAT44(uStack_1d4,local_1d8),
                        (ulong)(in_stack_fffffffffffffe38 + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",in_stack_fffffffffffffe30,
               (_func_bool_int_int_int_int_int *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe40
               ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe58,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe58);
      local_1d8 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)&stack0xfffffffffffffe58,&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      in_stack_fffffffffffffe48 = 0x33adb0;
      in_stack_fffffffffffffe50 = 0x269;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&local_1d8,(Fixed *)&stack0xfffffffffffffe58,false);
      if ((undefined1 *)CONCAT44(uStack_1d4,local_1d8) != &stack0xfffffffffffffe38) {
        operator_delete((undefined1 *)CONCAT44(uStack_1d4,local_1d8),
                        (ulong)(in_stack_fffffffffffffe38 + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"4",in_stack_fffffffffffffe30,
               (_func_bool_int_int_int_int_int *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe40
               ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe60);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&stack0xfffffffffffffe58,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&stack0xfffffffffffffe58);
      local_1d8 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)&stack0xfffffffffffffe58,&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&local_1d8,(Fixed *)&stack0xfffffffffffffe58,false);
      if ((undefined1 *)CONCAT44(uStack_1d4,local_1d8) != &stack0xfffffffffffffe38) {
        operator_delete((undefined1 *)CONCAT44(uStack_1d4,local_1d8),
                        (ulong)(in_stack_fffffffffffffe38 + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                  iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred5)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
}